

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::LessThanAction_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  bool bVar1;
  ScriptContext *scriptContext;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *argAction;
  TTDVar pvVar2;
  RecyclableObject *pRVar3;
  ScriptContext *pSVar4;
  int64 iVar5;
  RecyclableObject *__obj_1;
  Var object2;
  RecyclableObject *__obj;
  Var object1;
  JsRTDoubleVarSingleScalarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<2ul,1ul>,(TTD::NSLogEvents::EventKind)48>
                          (evt);
    pvVar2 = GetVarItem_0<2ul,1ul>(argAction);
    __obj = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar2);
    if (__obj != (RecyclableObject *)0x0) {
      bVar1 = Js::VarIs<Js::RecyclableObject>(__obj);
      if (bVar1) {
        pRVar3 = Js::VarTo<Js::RecyclableObject>(__obj);
        pSVar4 = Js::RecyclableObject::GetScriptContext(pRVar3);
        if (pSVar4 != scriptContext) {
          __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
        }
      }
      pvVar2 = GetVarItem_1<2ul,1ul>(argAction);
      __obj_1 = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar2);
      if (__obj_1 != (RecyclableObject *)0x0) {
        bVar1 = Js::VarIs<Js::RecyclableObject>(__obj_1);
        if (bVar1) {
          pRVar3 = Js::VarTo<Js::RecyclableObject>(__obj_1);
          pSVar4 = Js::RecyclableObject::GetScriptContext(pRVar3);
          if (pSVar4 != scriptContext) {
            __obj_1 = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
          }
        }
        iVar5 = GetScalarItem_0<2ul,1ul>(argAction);
        if (iVar5 == 0) {
          Js::JavascriptOperators::Less(__obj,__obj_1,scriptContext);
        }
        else {
          Js::JavascriptOperators::LessEqual(__obj,__obj_1,scriptContext);
        }
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void LessThanAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarSingleScalarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarSingleScalarArgumentAction, EventKind::LessThanActionTag>(evt);
            Js::Var object1 = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(object1, ctx);
            Js::Var object2 = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(object2, ctx);

            //Result is not needed but trigger computation for any effects
            if (GetScalarItem_0(action))
            {
                Js::JavascriptOperators::LessEqual(object1, object2, ctx);
            }
            else
            {
                Js::JavascriptOperators::Less(object1, object2, ctx);
            }
        }